

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HToyIO.cpp
# Opt level: O0

int readToy_MIP_cpp(char *filename,int *m_p,int *n_p,int *maxmin,double *offset,double **A,
                   double **b,double **c,double **lb,double **ub,int **integerColumn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  void *pvVar4;
  char *pcVar5;
  undefined8 in_RCX;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  double *in_R8;
  long *in_R9;
  bool bVar6;
  double dVar7;
  long *in_stack_00000008;
  int len_5;
  int len_4;
  int len_3;
  int c_n;
  int len_1;
  int ind;
  int len_2;
  int len;
  FILE *file_p;
  int k;
  int j;
  int i;
  char *term;
  int i_v;
  double rl_v;
  int rp_rd;
  int end;
  int start;
  int m;
  int n;
  char *fgets_rt;
  char buff [255];
  int buff_ln;
  int local_1ac;
  int local_18c;
  int local_188;
  uint local_184;
  int local_160;
  int local_15c;
  char local_148 [268];
  undefined4 local_3c;
  long *local_38;
  double *local_30;
  undefined8 local_28;
  int *local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  local_3c = 0xff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("readMPS: Trying to open file %s\n",in_RDI);
  __stream = fopen(local_10,"r");
  if (__stream == (FILE *)0x0) {
    printf("readInput: Not opened file OK\n");
    local_4 = 1;
  }
  else {
    printf("readInput: Opened file  OK\n");
    fgets(local_148,0xff,__stream);
    __isoc99_sscanf(local_148,"%d %d %d",local_18,local_20,local_28);
    iVar1 = *local_20;
    iVar3 = *local_18;
    pvVar4 = malloc((long)iVar1 << 3);
    *_len_5 = (long)pvVar4;
    pvVar4 = malloc((long)(iVar3 * iVar1) << 3);
    *local_38 = (long)pvVar4;
    pvVar4 = malloc((long)iVar3 << 3);
    *in_stack_00000008 = (long)pvVar4;
    pvVar4 = malloc((long)iVar1 << 3);
    *_len_3 = (long)pvVar4;
    pvVar4 = malloc((long)iVar1 << 3);
    *_len_1 = (long)pvVar4;
    pvVar4 = malloc((long)iVar1 << 2);
    *_len_2 = (long)pvVar4;
    fgets(local_148,0xff,__stream);
    local_15c = 0;
    while( true ) {
      bVar6 = false;
      if (local_148[local_15c] == ' ') {
        bVar6 = local_148[local_15c] != '\0';
      }
      if (!bVar6) break;
      local_15c = local_15c + 1;
    }
    local_15c = 0;
    for (local_188 = 0; local_188 <= iVar1; local_188 = local_188 + 1) {
      for (; local_148[local_15c] == ' '; local_15c = local_15c + 1) {
      }
      local_160 = local_15c;
      while( true ) {
        bVar6 = false;
        if (local_148[local_160] != ' ') {
          bVar6 = local_148[local_160] != '\0';
        }
        if (!bVar6) break;
        local_160 = local_160 + 1;
      }
      iVar2 = local_160 - local_15c;
      if (iVar2 < 1) {
        printf("Error reading file: not enough numbers on row of objective.\n");
        return 1;
      }
      pcVar5 = (char *)malloc((long)iVar2);
      for (local_18c = 0; local_18c < iVar2; local_18c = local_18c + 1) {
        pcVar5[local_18c] = local_148[local_15c + local_18c];
      }
      dVar7 = atof(pcVar5);
      if (local_188 < iVar1) {
        *(double *)(*_len_5 + (long)local_188 * 8) = dVar7;
        if (local_148[local_160] == '\0') {
          printf("Error reading file: not enough numbers on row of objective.\n");
          return 1;
        }
        local_15c = local_160 + 1;
      }
      else {
        *local_30 = dVar7;
      }
    }
    for (local_184 = 0; (int)local_184 < iVar3; local_184 = local_184 + 1) {
      fgets(local_148,0xff,__stream);
      local_15c = 0;
      while( true ) {
        bVar6 = false;
        if (local_148[local_15c] == ' ') {
          bVar6 = local_148[local_15c] != '\0';
        }
        if (!bVar6) break;
        local_15c = local_15c + 1;
      }
      if (local_148[local_15c] == '\0') {
        printf("Error reading file: not enough numbers on row %d of A.\n",(ulong)local_184);
      }
      local_188 = 0;
      while (local_188 < iVar1) {
        for (; local_148[local_15c] == ' '; local_15c = local_15c + 1) {
        }
        local_160 = local_15c;
        while( true ) {
          bVar6 = false;
          if (local_148[local_160] != ' ') {
            bVar6 = local_148[local_160] != '\0';
          }
          if (!bVar6) break;
          local_160 = local_160 + 1;
        }
        iVar2 = local_160 - local_15c;
        if (iVar2 < 1) {
          printf("Error reading file: not enough numbers on row for RHS.\n");
          return 1;
        }
        pcVar5 = (char *)malloc((long)iVar2);
        for (local_18c = 0; local_18c < iVar2; local_18c = local_18c + 1) {
          pcVar5[local_18c] = local_148[local_15c + local_18c];
        }
        dVar7 = atof(pcVar5);
        *(double *)(*local_38 + (long)(int)(local_188 * iVar3 + local_184) * 8) = dVar7;
        local_188 = local_188 + 1;
        if (local_148[local_160] == '\0') {
          printf("Error reading file: not enough numbers on constraint row.\n");
          return 1;
        }
        local_15c = local_160 + 1;
      }
      for (; local_148[local_15c] == ' '; local_15c = local_15c + 1) {
      }
      local_160 = local_15c;
      while( true ) {
        bVar6 = false;
        if (local_148[local_160] != ' ') {
          bVar6 = local_148[local_160] != '\0';
        }
        if (!bVar6) break;
        local_160 = local_160 + 1;
      }
      local_160 = local_160 - local_15c;
      if (local_160 < 1) {
        printf("Error reading file: not enough numbers on constraint row.\n");
        return 1;
      }
      pcVar5 = (char *)malloc((long)local_160);
      for (local_18c = 0; local_18c < local_160; local_18c = local_18c + 1) {
        pcVar5[local_18c] = local_148[local_15c + local_18c];
      }
      dVar7 = atof(pcVar5);
      *(double *)(*in_stack_00000008 + (long)(int)local_184 * 8) = dVar7;
    }
    for (local_1ac = 0; local_1ac < iVar1; local_1ac = local_1ac + 1) {
      *(undefined8 *)(*_len_3 + (long)local_1ac * 8) = 0;
      *(undefined8 *)(*_len_1 + (long)local_1ac * 8) = 0x6974e718d7d7625a;
      *(undefined4 *)(*_len_2 + (long)local_1ac * 4) = 0;
    }
    pcVar5 = fgets(local_148,0xff,__stream);
    if (pcVar5 == (char *)0x0) {
      fclose(__stream);
      local_4 = 0;
    }
    else {
      local_15c = 0;
      while( true ) {
        bVar6 = false;
        if (local_148[local_15c] == ' ') {
          bVar6 = local_148[local_15c] != '\0';
        }
        if (!bVar6) break;
        local_15c = local_15c + 1;
      }
      local_188 = 0;
      local_15c = 0;
      while (local_188 < iVar1) {
        for (; local_148[local_15c] == ' '; local_15c = local_15c + 1) {
        }
        local_160 = local_15c;
        while( true ) {
          bVar6 = false;
          if (local_148[local_160] != ' ') {
            bVar6 = local_148[local_160] != '\0';
          }
          if (!bVar6) break;
          local_160 = local_160 + 1;
        }
        iVar3 = local_160 - local_15c;
        if (iVar3 < 1) {
          printf("Comment reading file: no numbers on LB row.\n");
          return 0;
        }
        pcVar5 = (char *)malloc((long)iVar3);
        for (local_18c = 0; local_18c < iVar3; local_18c = local_18c + 1) {
          pcVar5[local_18c] = local_148[local_15c + local_18c];
        }
        dVar7 = atof(pcVar5);
        *(double *)(*_len_3 + (long)local_188 * 8) = dVar7;
        local_188 = local_188 + 1;
        if ((local_188 < iVar1) && (local_148[local_160] == '\0')) {
          printf("Error reading file: not enough numbers on LB row.\n");
          return 1;
        }
        local_15c = local_160 + 1;
      }
      pcVar5 = fgets(local_148,0xff,__stream);
      if (pcVar5 == (char *)0x0) {
        fclose(__stream);
        local_4 = 0;
      }
      else {
        local_15c = 0;
        while( true ) {
          bVar6 = false;
          if (local_148[local_15c] == ' ') {
            bVar6 = local_148[local_15c] != '\0';
          }
          if (!bVar6) break;
          local_15c = local_15c + 1;
        }
        local_188 = 0;
        local_15c = 0;
        while (local_188 < iVar1) {
          for (; local_148[local_15c] == ' '; local_15c = local_15c + 1) {
          }
          local_160 = local_15c;
          while( true ) {
            bVar6 = false;
            if (local_148[local_160] != ' ') {
              bVar6 = local_148[local_160] != '\0';
            }
            if (!bVar6) break;
            local_160 = local_160 + 1;
          }
          iVar3 = local_160 - local_15c;
          if (iVar3 < 1) {
            printf("Comment reading file: no numbers on UB row.\n");
            return 0;
          }
          pcVar5 = (char *)malloc((long)iVar3);
          for (local_18c = 0; local_18c < iVar3; local_18c = local_18c + 1) {
            pcVar5[local_18c] = local_148[local_15c + local_18c];
          }
          dVar7 = atof(pcVar5);
          *(double *)(*_len_1 + (long)local_188 * 8) = dVar7;
          local_188 = local_188 + 1;
          if ((local_188 < iVar1) && (local_148[local_160] == '\0')) {
            printf("Error reading file: not enough numbers on UB row.\n");
            return 1;
          }
          local_15c = local_160 + 1;
        }
        pcVar5 = fgets(local_148,0xff,__stream);
        if (pcVar5 == (char *)0x0) {
          fclose(__stream);
          local_4 = 0;
        }
        else {
          local_15c = 0;
          while( true ) {
            bVar6 = false;
            if (local_148[local_15c] == ' ') {
              bVar6 = local_148[local_15c] != '\0';
            }
            if (!bVar6) break;
            local_15c = local_15c + 1;
          }
          local_188 = 0;
          local_15c = 0;
          while (local_188 < iVar1) {
            for (; local_148[local_15c] == ' '; local_15c = local_15c + 1) {
            }
            local_160 = local_15c;
            while( true ) {
              bVar6 = false;
              if (local_148[local_160] != ' ') {
                bVar6 = local_148[local_160] != '\0';
              }
              if (!bVar6) break;
              local_160 = local_160 + 1;
            }
            iVar3 = local_160 - local_15c;
            if (iVar3 < 1) {
              printf("Comment reading file: no numbers on integerColumn row.\n");
              return 0;
            }
            pcVar5 = (char *)malloc((long)iVar3);
            for (local_18c = 0; local_18c < iVar3; local_18c = local_18c + 1) {
              pcVar5[local_18c] = local_148[local_15c + local_18c];
            }
            iVar3 = atoi(pcVar5);
            *(int *)(*_len_2 + (long)local_188 * 4) = iVar3;
            local_188 = local_188 + 1;
            if ((local_188 < iVar1) && (local_148[local_160] == '\0')) {
              printf("Error reading file: not enough numbers on integerColumn row.\n");
              return 1;
            }
            local_15c = local_160 + 1;
          }
          fclose(__stream);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int readToy_MIP_cpp(const char *filename, int* m_p, int* n_p, int* maxmin, double* offset,
		  double ** A,
		  double ** b, double ** c, double ** lb, double ** ub,
		  int** integerColumn) {
  const int buff_ln=255;
  char buff[buff_ln];
  char *fgets_rt;
  int n, m;
  int start, end;
  int rp_rd = 0;
  double rl_v;
  int i_v;
  char *term;
  int i, j, k;
  
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file_p = fopen(filename, "r");
    if (file_p == 0) {
#ifdef JAJH_dev
      printf("readInput: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readInput: Opened file  OK\n");
#endif
    fgets_rt = fgets(buff, buff_ln, file_p);
    
    sscanf(buff, "%d %d %d", m_p, n_p, maxmin);
    if (rp_rd > 0) printf("Read %d %d %d for m_p, n_p, maxmin\n", *(m_p), *(n_p), *(maxmin));
    n = *(n_p);
    m = *(m_p);
    
    //Allocate arrays
    *c = (double *) malloc(sizeof(double)*n);
    *A = (double *) malloc(sizeof(double)*(m*n));
    *b = (double *) malloc(sizeof(double)*m);
    *lb = (double *) malloc(sizeof(double)*n);
    *ub = (double *) malloc(sizeof(double)*n);
    *integerColumn = (int *) malloc(sizeof(int)*n);

    fgets_rt = fgets(buff, buff_ln, file_p);
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    //Read cost and offset
    j = 0;
    start = 0;
    while ( j <= n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on row of objective.\n");
	return 1;
      }
      
      rl_v = atof(term);
      if (j < n) {
	(*c)[j] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*c)[%d]\n", term, rl_v, j);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on row of objective.\n");
	  return 1;
	}	
	start = end + 1;
      }
      else {
	*offset = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for offset\n", term, rl_v);
	j++;
      }
    }
    
    //Read matrix and RHS
    i = 0;
    while (i < m) {
      fgets_rt = fgets(buff, buff_ln, file_p);
      
      start=0;
      while (buff[start]==' ' &&  buff[start] != '\0')
	start++;
      
      //JAJH: QY - This doesn't seem to do what was intended
      if (buff[start] == '\0')
	printf("Error reading file: not enough numbers on row %d of A.\n", i);
      
      j = 0;
      while (j < n) {
	while (buff[start]==' ')
	  start++;
	
	end = start;
	while (buff[end]!=' ' && buff[end] != '\0')
	  end++;
	
	int len = end - start;
	
	if (len>0) {
	  term = (char *) malloc(sizeof(char)*len);
	  for (k=0;k<len;k++)
	    term[k] = buff[start+k];
	} else {
	  //JAJH: QY - LEN<=0 means that the end of the line has been reached
	  printf("Error reading file: not enough numbers on row for RHS.\n");
	  return 1;
	}
	
	rl_v = atof(term);
	
	//Row-wise
	//	int ind = (i * n) + j;
	//Column-wise
	int ind = (j * m) + i;
	(*A)[ind] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*A)[%d]\n", term, rl_v, ind);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on constraint row.\n");
	  return 1;
	}	
	start = end + 1;
      }
      
      //RHS
      while (buff[start]==' ')
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on constraint row.\n");
	return 1;
      }
      
      rl_v = atof(term);
      (*b)[i] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*b)[%d]\n", term, rl_v, i);
      i++;
    }
    //Set up default values of lower bounds, upper bounds and integer information
    for (int c_n = 0; c_n < n; c_n++) {
      (*lb)[c_n] = 0;
      (*ub)[c_n] = HSOL_CONST_INF;
      (*integerColumn)[c_n] = 0;
    }

    //Read lower bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("LB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;

      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on LB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*lb)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*lb)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on LB row.\n");
	return 1;
      }
      start = end + 1;
    }
    
    //Read upper bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("UB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on UB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*ub)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*ub)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on UB row.\n");
	return 1;
      }
      start = end + 1;
    }

    //Read integer information for columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("IC: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on integerColumn row.\n");
	return 0;
      }
      
      i_v = atoi(term);
      (*integerColumn)[j] = i_v;
      if (rp_rd > 0) printf("Read %s giving %d for (*integerColumn)[%d]\n", term, i_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on integerColumn row.\n");
	return 1;
      }
      start = end + 1;
    }
    fclose(file_p);
    return 0;
}